

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParsePI(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  xmlCatalogAllow xVar2;
  xmlChar *val;
  void *pvVar3;
  bool bVar4;
  xmlCatalogAllow allow;
  int newSize;
  xmlChar *tmp;
  xmlChar *target;
  int l;
  int cur;
  size_t maxLength;
  size_t size;
  size_t len;
  xmlChar *buf;
  xmlParserCtxtPtr ctxt_local;
  
  len = 0;
  size = 0;
  maxLength = 100;
  iVar1 = 10000000;
  if ((ctxt->options & 0x80000U) != 0) {
    iVar1 = 1000000000;
  }
  _l = (long)iVar1;
  if ((*ctxt->input->cur == '<') && (ctxt->input->cur[1] == '?')) {
    ctxt->input->cur = ctxt->input->cur + 2;
    ctxt->input->col = ctxt->input->col + 2;
    buf = (xmlChar *)ctxt;
    if (*ctxt->input->cur == '\0') {
      xmlParserGrow(ctxt);
    }
    val = xmlParsePITarget((xmlParserCtxtPtr)buf);
    if (val == (xmlChar *)0x0) {
      xmlFatalErr((xmlParserCtxtPtr)buf,XML_ERR_PI_NOT_STARTED,(char *)0x0);
    }
    else if ((**(char **)(*(long *)(buf + 0x38) + 0x20) == '?') &&
            (*(char *)(*(long *)(*(long *)(buf + 0x38) + 0x20) + 1) == '>')) {
      *(long *)(*(long *)(buf + 0x38) + 0x20) = *(long *)(*(long *)(buf + 0x38) + 0x20) + 2;
      *(int *)(*(long *)(buf + 0x38) + 0x38) = *(int *)(*(long *)(buf + 0x38) + 0x38) + 2;
      if (**(char **)(*(long *)(buf + 0x38) + 0x20) == '\0') {
        xmlParserGrow((xmlParserCtxtPtr)buf);
      }
      if (((*(long *)buf != 0) && (*(int *)(buf + 0x14c) == 0)) &&
         (*(long *)(*(long *)buf + 0x98) != 0)) {
        (**(code **)(*(long *)buf + 0x98))(*(undefined8 *)(buf + 8),val,0);
      }
    }
    else {
      len = (size_t)(*xmlMalloc)(maxLength);
      if ((void *)len != (void *)0x0) {
        iVar1 = xmlSkipBlankChars((xmlParserCtxtPtr)buf);
        if (iVar1 == 0) {
          xmlFatalErrMsgStr((xmlParserCtxtPtr)buf,XML_ERR_SPACE_REQUIRED,
                            "ParsePI: PI %s space expected\n",val);
        }
        target._4_4_ = xmlCurrentCharRecover((xmlParserCtxtPtr)buf,(int *)&target);
        do {
          if (target._4_4_ < 0x100) {
            if (((8 < target._4_4_) && (target._4_4_ < 0xb)) ||
               ((target._4_4_ == 0xd || (bVar4 = false, 0x1f < target._4_4_)))) {
LAB_001418c0:
              bVar4 = true;
              if (target._4_4_ == 0x3f) {
                bVar4 = *(char *)(*(long *)(*(long *)(buf + 0x38) + 0x20) + 1) != '>';
              }
            }
          }
          else if ((((0xff < target._4_4_) && (target._4_4_ < 0xd800)) ||
                   ((0xdfff < target._4_4_ && (target._4_4_ < 0xfffe)))) ||
                  ((bVar4 = false, 0xffff < target._4_4_ && (bVar4 = false, target._4_4_ < 0x110000)
                   ))) goto LAB_001418c0;
          if (!bVar4) {
            *(undefined1 *)(len + size) = 0;
            if (target._4_4_ == 0x3f) {
              *(long *)(*(long *)(buf + 0x38) + 0x20) = *(long *)(*(long *)(buf + 0x38) + 0x20) + 2;
              *(int *)(*(long *)(buf + 0x38) + 0x38) = *(int *)(*(long *)(buf + 0x38) + 0x38) + 2;
              if (**(char **)(*(long *)(buf + 0x38) + 0x20) == '\0') {
                xmlParserGrow((xmlParserCtxtPtr)buf);
              }
              if ((((*(int *)(buf + 0x150) == 0) &&
                   (iVar1 = xmlStrEqual(val,(xmlChar *)"oasis-xml-catalog"), iVar1 != 0)) &&
                  (xVar2 = xmlCatalogGetDefaults(), (*(uint *)(buf + 0x234) & 0x4000000) != 0)) &&
                 ((xVar2 == XML_CATA_ALLOW_DOCUMENT || (xVar2 == XML_CATA_ALLOW_ALL)))) {
                xmlParseCatalogPI((xmlParserCtxtPtr)buf,(xmlChar *)len);
              }
              if (((*(long *)buf != 0) && (*(int *)(buf + 0x14c) == 0)) &&
                 (*(long *)(*(long *)buf + 0x98) != 0)) {
                (**(code **)(*(long *)buf + 0x98))(*(undefined8 *)(buf + 8),val,len);
              }
            }
            else {
              xmlFatalErrMsgStr((xmlParserCtxtPtr)buf,XML_ERR_PI_NOT_FINISHED,
                                "ParsePI: PI %s never end ...\n",val);
            }
            (*xmlFree)((void *)len);
            return;
          }
          if (maxLength <= size + 5) {
            iVar1 = xmlGrowCapacity((int)maxLength,1,1,(int)_l);
            if (iVar1 < 0) {
              xmlFatalErrMsgStr((xmlParserCtxtPtr)buf,XML_ERR_PI_NOT_FINISHED,"PI %s too big found",
                                val);
              (*xmlFree)((void *)len);
              return;
            }
            pvVar3 = (*xmlRealloc)((void *)len,(long)iVar1);
            if (pvVar3 == (void *)0x0) {
              xmlErrMemory((xmlParserCtxtPtr)buf);
              (*xmlFree)((void *)len);
              return;
            }
            maxLength = (size_t)iVar1;
            len = (size_t)pvVar3;
          }
          if (target._4_4_ < 0x80) {
            *(char *)(len + size) = (char)target._4_4_;
            size = size + 1;
          }
          else {
            iVar1 = xmlCopyCharMultiByte((xmlChar *)(len + size),target._4_4_);
            size = (long)iVar1 + size;
          }
          if (**(char **)(*(long *)(buf + 0x38) + 0x20) == '\n') {
            *(int *)(*(long *)(buf + 0x38) + 0x34) = *(int *)(*(long *)(buf + 0x38) + 0x34) + 1;
            *(undefined4 *)(*(long *)(buf + 0x38) + 0x38) = 1;
          }
          else {
            *(int *)(*(long *)(buf + 0x38) + 0x38) = *(int *)(*(long *)(buf + 0x38) + 0x38) + 1;
          }
          *(long *)(*(long *)(buf + 0x38) + 0x20) =
               *(long *)(*(long *)(buf + 0x38) + 0x20) + (long)(int)target;
          target._4_4_ = xmlCurrentCharRecover((xmlParserCtxtPtr)buf,(int *)&target);
        } while( true );
      }
      xmlErrMemory((xmlParserCtxtPtr)buf);
    }
  }
  return;
}

Assistant:

void
xmlParsePI(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    size_t len = 0;
    size_t size = XML_PARSER_BUFFER_SIZE;
    size_t maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                       XML_MAX_HUGE_LENGTH :
                       XML_MAX_TEXT_LENGTH;
    int cur, l;
    const xmlChar *target;

    if ((RAW == '<') && (NXT(1) == '?')) {
	/*
	 * this is a Processing Instruction.
	 */
	SKIP(2);

	/*
	 * Parse the target name and check for special support like
	 * namespace.
	 */
        target = xmlParsePITarget(ctxt);
	if (target != NULL) {
	    if ((RAW == '?') && (NXT(1) == '>')) {
		SKIP(2);

		/*
		 * SAX: PI detected.
		 */
		if ((ctxt->sax) && (!ctxt->disableSAX) &&
		    (ctxt->sax->processingInstruction != NULL))
		    ctxt->sax->processingInstruction(ctxt->userData,
		                                     target, NULL);
		return;
	    }
	    buf = xmlMalloc(size);
	    if (buf == NULL) {
		xmlErrMemory(ctxt);
		return;
	    }
	    if (SKIP_BLANKS == 0) {
		xmlFatalErrMsgStr(ctxt, XML_ERR_SPACE_REQUIRED,
			  "ParsePI: PI %s space expected\n", target);
	    }
	    cur = xmlCurrentCharRecover(ctxt, &l);
	    while (IS_CHAR(cur) && /* checked */
		   ((cur != '?') || (NXT(1) != '>'))) {
		if (len + 5 >= size) {
		    xmlChar *tmp;
                    int newSize;

                    newSize = xmlGrowCapacity(size, 1, 1, maxLength);
                    if (newSize < 0) {
                        xmlFatalErrMsgStr(ctxt, XML_ERR_PI_NOT_FINISHED,
                                          "PI %s too big found", target);
                        xmlFree(buf);
                        return;
                    }
		    tmp = xmlRealloc(buf, newSize);
		    if (tmp == NULL) {
			xmlErrMemory(ctxt);
			xmlFree(buf);
			return;
		    }
		    buf = tmp;
                    size = newSize;
		}
		COPY_BUF(buf, len, cur);
		NEXTL(l);
		cur = xmlCurrentCharRecover(ctxt, &l);
	    }
	    buf[len] = 0;
	    if (cur != '?') {
		xmlFatalErrMsgStr(ctxt, XML_ERR_PI_NOT_FINISHED,
		      "ParsePI: PI %s never end ...\n", target);
	    } else {
		SKIP(2);

#ifdef LIBXML_CATALOG_ENABLED
		if ((ctxt->inSubset == 0) &&
		    (xmlStrEqual(target, XML_CATALOG_PI))) {
		    xmlCatalogAllow allow = xmlCatalogGetDefaults();

		    if ((ctxt->options & XML_PARSE_CATALOG_PI) &&
                        ((allow == XML_CATA_ALLOW_DOCUMENT) ||
			 (allow == XML_CATA_ALLOW_ALL)))
			xmlParseCatalogPI(ctxt, buf);
		}
#endif

		/*
		 * SAX: PI detected.
		 */
		if ((ctxt->sax) && (!ctxt->disableSAX) &&
		    (ctxt->sax->processingInstruction != NULL))
		    ctxt->sax->processingInstruction(ctxt->userData,
		                                     target, buf);
	    }
	    xmlFree(buf);
	} else {
	    xmlFatalErr(ctxt, XML_ERR_PI_NOT_STARTED, NULL);
	}
    }
}